

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashrate.cpp
# Opt level: O1

Value __thiscall xmrig::Hashrate::normalize(Hashrate *this,double d)

{
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  double dVar1;
  Value VVar2;
  
  if ((uint)((long)ABS(d) + 0xfff0000000000000U >> 0x35) < 0x3ff) {
    dVar1 = floor(d * 100.0);
    this->m_threads = 0;
    this->m_top = (uint32_t *)0x0;
    this->m_threads = (size_t)(dVar1 * 0.01);
    *(undefined2 *)((long)&this->m_top + 6) = 0x216;
    in_RDX = extraout_RDX;
  }
  else {
    this->m_threads = 0;
    this->m_top = (uint32_t *)0x0;
  }
  VVar2.data_.s.str = (Ch *)in_RDX;
  VVar2.data_.n = (Number)this;
  return (Value)VVar2.data_;
}

Assistant:

rapidjson::Value xmrig::Hashrate::normalize(double d)
{
    using namespace rapidjson;

    if (!std::isnormal(d)) {
        return Value(kNullType);
    }

    return Value(floor(d * 100.0) / 100.0);
}